

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float32 propagateFloat32NaN(float32 a,float32 b,float_status *status)

{
  _Bool _Var1;
  int iVar2;
  FloatClass local_38;
  FloatClass local_34;
  FloatClass b_cls;
  FloatClass a_cls;
  uint32_t bv;
  uint32_t av;
  flag aIsLargerSignificand;
  float_status *status_local;
  float32 b_local;
  float32 a_local;
  
  iVar2 = float32_is_any_nan(a);
  if (iVar2 == 0) {
    local_34 = float_class_normal;
  }
  else {
    iVar2 = float32_is_signaling_nan_tricore(a,status);
    local_34 = float_class_qnan;
    if (iVar2 != 0) {
      local_34 = float_class_snan;
    }
  }
  iVar2 = float32_is_any_nan(b);
  if (iVar2 == 0) {
    local_38 = float_class_normal;
  }
  else {
    iVar2 = float32_is_signaling_nan_tricore(b,status);
    local_38 = float_class_qnan;
    if (iVar2 != 0) {
      local_38 = float_class_snan;
    }
  }
  _Var1 = is_snan(local_34);
  if ((_Var1) || (_Var1 = is_snan(local_38), _Var1)) {
    float_raise_tricore('\x01',status);
  }
  if (status->default_nan_mode == '\0') {
    if (a << 1 < b << 1) {
      bv._3_1_ = false;
    }
    else if (b << 1 < a << 1) {
      bv._3_1_ = true;
    }
    else {
      bv._3_1_ = a < b;
    }
    iVar2 = pickNaN(local_34,local_38,bv._3_1_);
    if (iVar2 == 0) {
      _Var1 = is_snan(local_34);
      b_local = a;
      if (_Var1) {
        b_local = float32_silence_nan_tricore(a,status);
      }
    }
    else {
      _Var1 = is_snan(local_38);
      b_local = b;
      if (_Var1) {
        b_local = float32_silence_nan_tricore(b,status);
      }
    }
  }
  else {
    b_local = float32_default_nan_tricore(status);
  }
  return b_local;
}

Assistant:

static float32 propagateFloat32NaN(float32 a, float32 b, float_status *status)
{
    flag aIsLargerSignificand;
    uint32_t av, bv;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float32_is_any_nan(a)
             ? float_class_normal
             : float32_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float32_is_any_nan(b)
             ? float_class_normal
             : float32_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    av = float32_val(a);
    bv = float32_val(b);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float32_default_nan(status);
    }

    if ((uint32_t)(av << 1) < (uint32_t)(bv << 1)) {
        aIsLargerSignificand = 0;
    } else if ((uint32_t)(bv << 1) < (uint32_t)(av << 1)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (av < bv) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float32_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float32_silence_nan(a, status);
        }
        return a;
    }
}